

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldGenerator::GenerateMessageMapBuilderMembers
          (ImmutableMapFieldGenerator *this,Printer *printer)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  size_t sVar1;
  size_t sVar2;
  FieldDescriptor *pFVar3;
  pointer pcVar4;
  Context *pCVar5;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view begin_varname;
  string_view begin_varname_00;
  string_view begin_varname_01;
  string_view begin_varname_02;
  string_view begin_varname_03;
  string_view begin_varname_04;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view text_14;
  string_view text_15;
  string_view text_16;
  string_view text_17;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  string_view end_varname_02;
  string_view end_varname_03;
  string_view end_varname_04;
  undefined1 local_170 [8];
  _Alloc_hider local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  undefined2 local_128;
  undefined1 local_120 [8];
  _Alloc_hider local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined2 local_d8;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined2 local_88;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined2 local_38;
  
  vars = &this->variables_;
  text_04._M_str =
       "private static final class $capitalized_name$Converter implements com.google.protobuf.MapFieldBuilder.Converter<$boxed_key_type$, $value_interface_type$, $boxed_value_type$> {\n"
  ;
  text_04._M_len = 0xb0;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_04);
  sVar1 = (printer->options_).spaces_per_indent;
  printer->indent_ = printer->indent_ + sVar1;
  text._M_str = "@java.lang.Override\n";
  text._M_len = 0x14;
  io::Printer::Print<>(printer,text);
  text_05._M_str = "public $boxed_value_type$ build($value_interface_type$ val) {\n";
  text_05._M_len = 0x3e;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_05);
  sVar2 = (printer->options_).spaces_per_indent;
  printer->indent_ = printer->indent_ + sVar2;
  text_06._M_str = "if (val instanceof $boxed_value_type$) { return ($boxed_value_type$) val; }\n";
  text_06._M_len = 0x4c;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_06);
  text_07._M_str = "return (($value_builder_type$) val).build();\n";
  text_07._M_len = 0x2d;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_07);
  printer->indent_ = printer->indent_ - sVar2;
  text_00._M_str = "}\n\n";
  text_00._M_len = 3;
  io::Printer::Print<>(printer,text_00);
  text_01._M_str = "@java.lang.Override\n";
  text_01._M_len = 0x14;
  io::Printer::Print<>(printer,text_01);
  text_08._M_str =
       "public com.google.protobuf.MapEntry<$boxed_key_type$, $boxed_value_type$> defaultEntry() {\n"
  ;
  text_08._M_len = 0x5b;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_08);
  sVar2 = (printer->options_).spaces_per_indent;
  printer->indent_ = printer->indent_ + sVar2;
  text_09._M_str = "return $capitalized_name$DefaultEntryHolder.defaultEntry;\n";
  text_09._M_len = 0x3a;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_09);
  printer->indent_ = printer->indent_ - sVar2;
  text_02._M_str = "}\n";
  text_02._M_len = 2;
  io::Printer::Print<>(printer,text_02);
  printer->indent_ = printer->indent_ - sVar1;
  text_03._M_str = "};\n";
  text_03._M_len = 3;
  io::Printer::Print<>(printer,text_03);
  text_10._M_str =
       "private static final $capitalized_name$Converter $name$Converter = new $capitalized_name$Converter();\n\n"
  ;
  text_10._M_len = 0x67;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_10);
  text_11._M_str =
       "private com.google.protobuf.MapFieldBuilder<\n    $builder_type_parameters$> $name$_;\n$deprecation$private com.google.protobuf.MapFieldBuilder<$builder_type_parameters$>\n    internalGet$capitalized_name$() {\n  if ($name$_ == null) {\n    return new com.google.protobuf.MapFieldBuilder<>($name$Converter);\n  }\n  return $name$_;\n}\n$deprecation$private com.google.protobuf.MapFieldBuilder<$builder_type_parameters$>\n    internalGetMutable$capitalized_name$() {\n  if ($name$_ == null) {\n    $name$_ = new com.google.protobuf.MapFieldBuilder<>($name$Converter);\n  }\n  $set_has_field_bit_builder$\n  $on_changed$\n  return $name$_;\n}\n"
  ;
  text_11._M_len = 0x270;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_11);
  GenerateMessageMapGetters(this,printer);
  text_12._M_str =
       "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n  $clear_has_field_bit_builder$\n  internalGetMutable$capitalized_name$().clear();\n  return this;\n}\n"
  ;
  text_12._M_len = 0xa1;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_12);
  begin_varname._M_str = "{";
  begin_varname._M_len = 1;
  end_varname._M_str = "}";
  end_varname._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname,end_varname,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x100000001);
  pFVar3 = this->descriptor_;
  pCVar5 = this->context_;
  local_80[4] = (pCVar5->options_).opensource_runtime;
  local_80[5] = (pCVar5->options_).annotate_code;
  local_80[0] = (pCVar5->options_).generate_immutable_code;
  local_80[1] = (pCVar5->options_).generate_mutable_code;
  local_80[2] = (pCVar5->options_).generate_shared_code;
  local_80[3] = (pCVar5->options_).enforce_lite;
  local_78._M_p = (pointer)&local_68;
  pcVar4 = (pCVar5->options_).annotation_list_file._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar4,
             pcVar4 + (pCVar5->options_).annotation_list_file._M_string_length);
  pcVar4 = (pCVar5->options_).output_list_file._M_dataplus._M_p;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar4,
             pcVar4 + (pCVar5->options_).output_list_file._M_string_length);
  local_38._0_1_ = (pCVar5->options_).strip_nonfunctional_codegen;
  local_38._1_1_ = (pCVar5->options_).jvm_dsl;
  WriteFieldDocComment(printer,pFVar3,(Options *)local_80,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  text_13._M_str =
       "$deprecation$public Builder ${$remove$capitalized_name$$}$(\n    $key_type$ key) {\n  $key_null_check$\n  internalGetMutable$capitalized_name$().ensureBuilderMap()\n      .remove(key);\n  return this;\n}\n"
  ;
  text_13._M_len = 0xc6;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_13);
  begin_varname_00._M_str = "{";
  begin_varname_00._M_len = 1;
  end_varname_00._M_str = "}";
  end_varname_00._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_00,end_varname_00,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x100000001);
  pCVar5 = this->context_;
  if ((pCVar5->options_).opensource_runtime == true) {
    text_14._M_str =
         "/**\n * Use alternate mutation accessors instead.\n */\n@java.lang.Deprecated\npublic java.util.Map<$type_parameters$>\n    ${$getMutable$capitalized_name$$}$() {\n  $set_has_field_bit_builder$\n  return internalGetMutable$capitalized_name$().ensureMessageMap();\n}\n"
    ;
    text_14._M_len = 0x102;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_14);
    begin_varname_01._M_str = "{";
    begin_varname_01._M_len = 1;
    end_varname_01._M_str = "}";
    end_varname_01._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_01,end_varname_01,this->descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    pCVar5 = this->context_;
  }
  pFVar3 = this->descriptor_;
  local_d0[4] = (pCVar5->options_).opensource_runtime;
  local_d0[5] = (pCVar5->options_).annotate_code;
  local_d0[0] = (pCVar5->options_).generate_immutable_code;
  local_d0[1] = (pCVar5->options_).generate_mutable_code;
  local_d0[2] = (pCVar5->options_).generate_shared_code;
  local_d0[3] = (pCVar5->options_).enforce_lite;
  local_c8._M_p = (pointer)&local_b8;
  pcVar4 = (pCVar5->options_).annotation_list_file._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar4,
             pcVar4 + (pCVar5->options_).annotation_list_file._M_string_length);
  pcVar4 = (pCVar5->options_).output_list_file._M_dataplus._M_p;
  local_a8._M_p = (pointer)&local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar4,
             pcVar4 + (pCVar5->options_).output_list_file._M_string_length);
  local_88._0_1_ = (pCVar5->options_).strip_nonfunctional_codegen;
  local_88._1_1_ = (pCVar5->options_).jvm_dsl;
  WriteFieldDocComment(printer,pFVar3,(Options *)local_d0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_p != &local_98) {
    operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
  }
  text_15._M_str =
       "$deprecation$public Builder ${$put$capitalized_name$$}$(\n    $key_type$ key,\n    $value_type$ value) {\n  $key_null_check$\n  $value_null_check$\n  internalGetMutable$capitalized_name$().ensureBuilderMap()\n      .put(key, value);\n  $set_has_field_bit_builder$\n  return this;\n}\n"
  ;
  text_15._M_len = 0x112;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_15);
  begin_varname_02._M_str = "{";
  begin_varname_02._M_len = 1;
  end_varname_02._M_str = "}";
  end_varname_02._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_02,end_varname_02,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x100000001);
  pFVar3 = this->descriptor_;
  pCVar5 = this->context_;
  local_120[4] = (pCVar5->options_).opensource_runtime;
  local_120[5] = (pCVar5->options_).annotate_code;
  local_120[0] = (pCVar5->options_).generate_immutable_code;
  local_120[1] = (pCVar5->options_).generate_mutable_code;
  local_120[2] = (pCVar5->options_).generate_shared_code;
  local_120[3] = (pCVar5->options_).enforce_lite;
  local_118._M_p = (pointer)&local_108;
  pcVar4 = (pCVar5->options_).annotation_list_file._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar4,
             pcVar4 + (pCVar5->options_).annotation_list_file._M_string_length);
  pcVar4 = (pCVar5->options_).output_list_file._M_dataplus._M_p;
  local_f8._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar4,
             pcVar4 + (pCVar5->options_).output_list_file._M_string_length);
  local_d8._0_1_ = (pCVar5->options_).strip_nonfunctional_codegen;
  local_d8._1_1_ = (pCVar5->options_).jvm_dsl;
  WriteFieldDocComment(printer,pFVar3,(Options *)local_120,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_p != &local_e8) {
    operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_p != &local_108) {
    operator_delete(local_118._M_p,local_108._M_allocated_capacity + 1);
  }
  text_16._M_str =
       "$deprecation$public Builder ${$putAll$capitalized_name$$}$(\n    java.util.Map<$type_parameters$> values) {\n  for (java.util.Map.Entry<$type_parameters$> e : values.entrySet()) {\n    if (e.getKey() == null || e.getValue() == null) {\n      throw new NullPointerException();\n    }\n  }\n  internalGetMutable$capitalized_name$().ensureBuilderMap()\n      .putAll(values);\n  $set_has_field_bit_builder$\n  return this;\n}\n"
  ;
  text_16._M_len = 0x19c;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_16);
  begin_varname_03._M_str = "{";
  begin_varname_03._M_len = 1;
  end_varname_03._M_str = "}";
  end_varname_03._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_03,end_varname_03,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x100000001);
  pFVar3 = this->descriptor_;
  pCVar5 = this->context_;
  local_170[4] = (pCVar5->options_).opensource_runtime;
  local_170[5] = (pCVar5->options_).annotate_code;
  local_170[0] = (pCVar5->options_).generate_immutable_code;
  local_170[1] = (pCVar5->options_).generate_mutable_code;
  local_170[2] = (pCVar5->options_).generate_shared_code;
  local_170[3] = (pCVar5->options_).enforce_lite;
  local_168._M_p = (pointer)&local_158;
  pcVar4 = (pCVar5->options_).annotation_list_file._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_168,pcVar4,
             pcVar4 + (pCVar5->options_).annotation_list_file._M_string_length);
  pcVar4 = (pCVar5->options_).output_list_file._M_dataplus._M_p;
  local_148._M_p = (pointer)&local_138;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,pcVar4,
             pcVar4 + (pCVar5->options_).output_list_file._M_string_length);
  local_128._0_1_ = (pCVar5->options_).strip_nonfunctional_codegen;
  local_128._1_1_ = (pCVar5->options_).jvm_dsl;
  WriteFieldDocComment(printer,pFVar3,(Options *)local_170,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_p != &local_138) {
    operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_p != &local_158) {
    operator_delete(local_168._M_p,local_158._M_allocated_capacity + 1);
  }
  text_17._M_str =
       "$deprecation$public $value_builder_type$ ${$put$capitalized_name$BuilderIfAbsent$}$(\n    $key_type$ key) {\n  java.util.Map<$boxed_key_type$, $value_interface_type$> builderMap = internalGetMutable$capitalized_name$().ensureBuilderMap();\n  $value_interface_type$ entry = builderMap.get(key);\n  if (entry == null) {\n    entry = $value_type$.newBuilder();\n    builderMap.put(key, entry);\n  }\n  if (entry instanceof $value_type$) {\n    entry = (($value_type$) entry).toBuilder();\n    builderMap.put(key, entry);\n  }\n  return ($value_builder_type$) entry;\n}\n"
  ;
  text_17._M_len = 0x229;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_17);
  begin_varname_04._M_str = "{";
  begin_varname_04._M_len = 1;
  end_varname_04._M_str = "}";
  end_varname_04._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_04,end_varname_04,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x100000001);
  return;
}

Assistant:

void ImmutableMapFieldGenerator::GenerateMessageMapBuilderMembers(
    io::Printer* printer) const {
  printer->Print(
      variables_,
      "private static final class $capitalized_name$Converter implements "
      "com.google.protobuf.MapFieldBuilder.Converter<$boxed_key_type$, "
      "$value_interface_type$, $boxed_value_type$> "
      "{\n");
  {
    auto i1 = printer->WithIndent();
    printer->Print("@java.lang.Override\n");
    printer->Print(
        variables_,
        "public $boxed_value_type$ build($value_interface_type$ val) {\n");
    {
      auto i2 = printer->WithIndent();
      printer->Print(variables_,
                     "if (val instanceof $boxed_value_type$) {"
                     " return ($boxed_value_type$) val; }\n");
      printer->Print(variables_,
                     "return (($value_builder_type$) val).build();\n");
    }
    printer->Print("}\n\n");

    printer->Print("@java.lang.Override\n");
    printer->Print(variables_,
                   "public com.google.protobuf.MapEntry<$boxed_key_type$, "
                   "$boxed_value_type$> defaultEntry() {\n");
    {
      auto i2 = printer->WithIndent();
      printer->Print(
          variables_,
          "return $capitalized_name$DefaultEntryHolder.defaultEntry;\n");
    }
    printer->Print("}\n");
  }
  printer->Print("};\n");
  printer->Print(variables_,
                 "private static final $capitalized_name$Converter "
                 "$name$Converter = new $capitalized_name$Converter();\n\n");

  printer->Print(
      variables_,
      "private com.google.protobuf.MapFieldBuilder<\n"
      "    $builder_type_parameters$> $name$_;\n"
      "$deprecation$private "
      "com.google.protobuf.MapFieldBuilder<$builder_type_parameters$>\n"
      "    internalGet$capitalized_name$() {\n"
      "  if ($name$_ == null) {\n"
      "    return new com.google.protobuf.MapFieldBuilder<>($name$Converter);\n"
      "  }\n"
      "  return $name$_;\n"
      "}\n"
      "$deprecation$private "
      "com.google.protobuf.MapFieldBuilder<$builder_type_parameters$>\n"
      "    internalGetMutable$capitalized_name$() {\n"
      "  if ($name$_ == null) {\n"
      "    $name$_ = new "
      "com.google.protobuf.MapFieldBuilder<>($name$Converter);\n"
      "  }\n"
      "  $set_has_field_bit_builder$\n"
      "  $on_changed$\n"
      "  return $name$_;\n"
      "}\n");
  GenerateMessageMapGetters(printer);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n"
      "  $clear_has_field_bit_builder$\n"
      "  internalGetMutable$capitalized_name$().clear();\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);

  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$public Builder ${$remove$capitalized_name$$}$(\n"
                 "    $key_type$ key) {\n"
                 "  $key_null_check$\n"
                 "  internalGetMutable$capitalized_name$().ensureBuilderMap()\n"
                 "      .remove(key);\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);

  if (context_->options().opensource_runtime) {
    printer->Print(
        variables_,
        "/**\n"
        " * Use alternate mutation accessors instead.\n"
        " */\n"
        "@java.lang.Deprecated\n"
        "public java.util.Map<$type_parameters$>\n"
        "    ${$getMutable$capitalized_name$$}$() {\n"
        "  $set_has_field_bit_builder$\n"
        "  return internalGetMutable$capitalized_name$().ensureMessageMap();\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
  }

  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$public Builder ${$put$capitalized_name$$}$(\n"
                 "    $key_type$ key,\n"
                 "    $value_type$ value) {\n"
                 "  $key_null_check$\n"
                 "  $value_null_check$\n"
                 "  internalGetMutable$capitalized_name$().ensureBuilderMap()\n"
                 "      .put(key, value);\n"
                 "  $set_has_field_bit_builder$\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);

  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$putAll$capitalized_name$$}$(\n"
      "    java.util.Map<$type_parameters$> values) {\n"
      "  for (java.util.Map.Entry<$type_parameters$> e : values.entrySet()) {\n"
      "    if (e.getKey() == null || e.getValue() == null) {\n"
      "      throw new NullPointerException();\n"
      "    }\n"
      "  }\n"
      "  internalGetMutable$capitalized_name$().ensureBuilderMap()\n"
      "      .putAll(values);\n"
      "  $set_has_field_bit_builder$\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);

  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "$deprecation$public $value_builder_type$ "
      "${$put$capitalized_name$BuilderIfAbsent$}$(\n"
      "    $key_type$ key) {\n"
      "  java.util.Map<$boxed_key_type$, $value_interface_type$> builderMap = "
      "internalGetMutable$capitalized_name$().ensureBuilderMap();\n"
      "  $value_interface_type$ entry = builderMap.get(key);\n"
      "  if (entry == null) {\n"
      "    entry = $value_type$.newBuilder();\n"
      "    builderMap.put(key, entry);\n"
      "  }\n"
      "  if (entry instanceof $value_type$) {\n"
      "    entry = (($value_type$) entry).toBuilder();\n"
      "    builderMap.put(key, entry);\n"
      "  }\n"
      "  return ($value_builder_type$) entry;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
}